

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_tables.cpp
# Opt level: O1

void ImGui::TableUpdateColumnsWeightFromWidth(ImGuiTable *table)

{
  float fVar1;
  long lVar2;
  ImGuiTableColumn *p;
  ImGuiTableColumn *pIVar3;
  long lVar4;
  float fVar5;
  float fVar6;
  
  if ((table->LeftMostStretchedColumn == -1) || (table->RightMostStretchedColumn == -1)) {
    __assert_fail("table->LeftMostStretchedColumn != -1 && table->RightMostStretchedColumn != -1",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/aatifjiwani[P]lens-flare/src/imgui/imgui_tables.cpp"
                  ,0x832,"void ImGui::TableUpdateColumnsWeightFromWidth(ImGuiTable *)");
  }
  lVar2 = (long)table->ColumnsCount;
  fVar6 = 0.0;
  fVar5 = 0.0;
  if (0 < lVar2) {
    pIVar3 = (table->Columns).Data;
    lVar4 = lVar2;
    fVar5 = 0.0;
    fVar6 = 0.0;
    do {
      if ((table->Columns).DataEnd <= pIVar3) goto LAB_0019d9bc;
      if ((pIVar3->IsEnabled == true) && ((pIVar3->Flags & 4) != 0)) {
        if (pIVar3->StretchWeight <= 0.0) {
          __assert_fail("column->StretchWeight > 0.0f",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/aatifjiwani[P]lens-flare/src/imgui/imgui_tables.cpp"
                        ,0x83c,"void ImGui::TableUpdateColumnsWeightFromWidth(ImGuiTable *)");
        }
        fVar5 = fVar5 + pIVar3->StretchWeight;
        fVar6 = fVar6 + pIVar3->WidthRequest;
      }
      pIVar3 = pIVar3 + 1;
      lVar4 = lVar4 + -1;
    } while (lVar4 != 0);
  }
  if ((fVar5 <= 0.0) || (fVar6 <= 0.0)) {
    __assert_fail("visible_weight > 0.0f && visible_width > 0.0f",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/aatifjiwani[P]lens-flare/src/imgui/imgui_tables.cpp"
                  ,0x840,"void ImGui::TableUpdateColumnsWeightFromWidth(ImGuiTable *)");
  }
  if (0 < table->ColumnsCount) {
    pIVar3 = (table->Columns).Data;
    do {
      if ((table->Columns).DataEnd <= pIVar3) {
LAB_0019d9bc:
        __assert_fail("p >= Data && p < DataEnd",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/aatifjiwani[P]lens-flare/src/imgui/imgui_internal.h"
                      ,0x216,"T &ImSpan<ImGuiTableColumn>::operator[](int) [T = ImGuiTableColumn]");
      }
      if (((pIVar3->IsEnabled == true) && ((pIVar3->Flags & 4) != 0)) &&
         (fVar1 = fVar5 * (pIVar3->WidthRequest / fVar6), pIVar3->StretchWeight = fVar1,
         fVar1 <= 0.0)) {
        __assert_fail("column->StretchWeight > 0.0f",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/aatifjiwani[P]lens-flare/src/imgui/imgui_tables.cpp"
                      ,0x849,"void ImGui::TableUpdateColumnsWeightFromWidth(ImGuiTable *)");
      }
      pIVar3 = pIVar3 + 1;
      lVar2 = lVar2 + -1;
    } while (lVar2 != 0);
  }
  return;
}

Assistant:

void ImGui::TableUpdateColumnsWeightFromWidth(ImGuiTable* table)
{
    IM_ASSERT(table->LeftMostStretchedColumn != -1 && table->RightMostStretchedColumn != -1);

    // Measure existing quantity
    float visible_weight = 0.0f;
    float visible_width = 0.0f;
    for (int column_n = 0; column_n < table->ColumnsCount; column_n++)
    {
        ImGuiTableColumn* column = &table->Columns[column_n];
        if (!column->IsEnabled || !(column->Flags & ImGuiTableColumnFlags_WidthStretch))
            continue;
        IM_ASSERT(column->StretchWeight > 0.0f);
        visible_weight += column->StretchWeight;
        visible_width += column->WidthRequest;
    }
    IM_ASSERT(visible_weight > 0.0f && visible_width > 0.0f);

    // Apply new weights
    for (int column_n = 0; column_n < table->ColumnsCount; column_n++)
    {
        ImGuiTableColumn* column = &table->Columns[column_n];
        if (!column->IsEnabled || !(column->Flags & ImGuiTableColumnFlags_WidthStretch))
            continue;
        column->StretchWeight = (column->WidthRequest / visible_width) * visible_weight;
        IM_ASSERT(column->StretchWeight > 0.0f);
    }
}